

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdCreatePsbtHandle(void *handle,int net_type,char *psbt_string,char *tx_hex_string,
                       uint32_t version,uint32_t locktime,void **psbt_handle)

{
  bool bVar1;
  undefined8 uVar2;
  void *pvVar3;
  char *in_RCX;
  char *in_RDX;
  undefined8 *in_stack_00000008;
  CfdException *except;
  exception *std_except;
  string err_msg;
  CfdException *fail_base64;
  Psbt psbt;
  NetType network_type;
  bool is_bitcoin;
  CfdCapiPsbtHandle *buffer;
  int result;
  uint32_t in_stack_fffffffffffffad8;
  uint32_t in_stack_fffffffffffffadc;
  Psbt *in_stack_fffffffffffffae0;
  string *in_stack_fffffffffffffaf0;
  undefined8 in_stack_fffffffffffffaf8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffb00;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  Psbt *in_stack_fffffffffffffb20;
  bool *in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb44;
  undefined4 in_stack_fffffffffffffb98;
  uint32_t in_stack_fffffffffffffb9c;
  Psbt *in_stack_fffffffffffffba0;
  string local_458 [167];
  allocator local_3b1;
  string local_3b0;
  Transaction local_390 [6];
  allocator local_1d9;
  string local_1d8 [294];
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  NetType local_90;
  byte local_8b;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  void *local_40;
  undefined4 local_34;
  char *local_28;
  char *local_20;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffaf8 >> 0x20);
  local_34 = 0xffffffff;
  local_40 = (void *)0x0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  if (in_stack_00000008 == (undefined8 *)0x0) {
    local_68.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_68.filename = local_68.filename + 1;
    local_68.line = 0x110;
    local_68.funcname = "CfdCreatePsbtHandle";
    cfd::core::logger::warn<>(&local_68,"psbt_handle is null.");
    local_8a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Failed to parameter. psbt_handle is null.",&local_89);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb00,error_code,in_stack_fffffffffffffaf0);
    local_8a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_8b = 0;
  local_90 = cfd::capi::ConvertNetType(in_stack_fffffffffffffb44,in_stack_fffffffffffffb38);
  if ((local_8b & 1) != 0) {
    cfd::Psbt::Psbt(in_stack_fffffffffffffae0);
    bVar1 = cfd::capi::IsEmptyString(local_20);
    if (bVar1) {
      in_stack_fffffffffffffb1f = cfd::capi::IsEmptyString(local_28);
      if ((bool)in_stack_fffffffffffffb1f) {
        cfd::Psbt::Psbt(in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
                        in_stack_fffffffffffffad8);
        cfd::Psbt::operator=
                  (in_stack_fffffffffffffba0,
                   (Psbt *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        cfd::Psbt::~Psbt(in_stack_fffffffffffffae0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3b0,local_28,&local_3b1);
        cfd::core::Transaction::Transaction(local_390,&local_3b0);
        cfd::Psbt::Psbt(in_stack_fffffffffffffae0,
                        (Transaction *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8)
                       );
        cfd::Psbt::operator=
                  (in_stack_fffffffffffffba0,
                   (Psbt *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        cfd::Psbt::~Psbt(in_stack_fffffffffffffae0);
        cfd::core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffffae0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,local_20,&local_1d9);
      cfd::Psbt::Psbt(in_stack_fffffffffffffae0,
                      (string *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      cfd::Psbt::operator=
                (in_stack_fffffffffffffba0,
                 (Psbt *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      cfd::Psbt::~Psbt(in_stack_fffffffffffffae0);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    }
    paVar4 = (allocator *)&stack0xfffffffffffffba7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_458,"PsbtHandle",paVar4);
    local_40 = cfd::capi::AllocBuffer((string *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c)
    ;
    std::__cxx11::string::~string(local_458);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffba7);
    pvVar3 = operator_new(0x80);
    cfd::Psbt::Psbt(in_stack_fffffffffffffb20,
                    (Psbt *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
    *(void **)((long)local_40 + 0x18) = pvVar3;
    *(NetType *)((long)local_40 + 0x10) = local_90;
    *in_stack_00000008 = local_40;
    local_4 = 0;
    cfd::Psbt::~Psbt(in_stack_fffffffffffffae0);
    return local_4;
  }
  local_b2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Elements is not supported.",&local_b1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffb00,error_code,in_stack_fffffffffffffaf0);
  local_b2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreatePsbtHandle(
    void* handle, int net_type, const char* psbt_string,
    const char* tx_hex_string, uint32_t version, uint32_t locktime,
    void** psbt_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiPsbtHandle* buffer = nullptr;
  try {
    cfd::Initialize();

    if (psbt_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. psbt_handle is null.");
    }
    bool is_bitcoin = false;
    NetType network_type = ConvertNetType(net_type, &is_bitcoin);
    if (!is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
    }

    Psbt psbt;
    if (!IsEmptyString(psbt_string)) {
      try {
        psbt = Psbt(psbt_string);
      } catch (const CfdException& fail_base64) {
        std::string err_msg(fail_base64.what());
        if (err_msg != "psbt unmatch magic error.") {
          throw fail_base64;
        }
        psbt = Psbt(ByteData(psbt_string));
      }
    } else if (!IsEmptyString(tx_hex_string)) {
      psbt = Psbt(Transaction(tx_hex_string));
    } else {
      psbt = Psbt(version, locktime);
    }

    buffer = static_cast<CfdCapiPsbtHandle*>(
        AllocBuffer(kPrefixPsbtHandle, sizeof(CfdCapiPsbtHandle)));
    buffer->psbt = new Psbt(psbt);
    buffer->net_type = network_type;
    *psbt_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreePsbtHandle(handle, buffer);
  return result;
}